

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool gguf_read_emplace_helper<std::__cxx11::string>
               (gguf_reader *gr,vector<gguf_kv,_std::allocator<gguf_kv>_> *kv,string *key,
               bool is_array,size_t n)

{
  bool bVar1;
  ulong uVar2;
  byte in_CL;
  undefined7 in_register_00000009;
  void *__buf;
  gguf_reader *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value_1;
  length_error *anon_var_0;
  bad_alloc *anon_var_0_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  vector<gguf_kv,_std::allocator<gguf_kv>_> *in_stack_ffffffffffffff50;
  gguf_reader *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  uint local_58;
  byte local_21;
  gguf_reader *local_10;
  byte local_1;
  
  local_21 = in_CL & 1;
  if (local_21 == 0) {
    __args_1 = &local_88;
    local_10 = in_RDI;
    std::__cxx11::string::string((string *)__args_1);
    uVar2 = gguf_reader::read(local_10,(int)__args_1,__buf,CONCAT71(in_register_00000009,in_CL));
    bVar1 = (uVar2 & 1) != 0;
    if (bVar1) {
      std::vector<gguf_kv,std::allocator<gguf_kv>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string&>
                (in_stack_ffffffffffffff50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17((char)uVar2,in_stack_ffffffffffffff48),__args_1);
    }
    else {
      local_1 = 0;
    }
    local_58 = (uint)!bVar1;
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x193c92);
    bVar1 = gguf_reader::read<std::__cxx11::string>
                      (in_stack_ffffffffffffff58,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (bVar1) {
      std::vector<gguf_kv,std::allocator<gguf_kv>>::
      emplace_back<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                (in_stack_ffffffffffffff50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40);
    }
    else {
      local_1 = 0;
    }
    local_58 = (uint)!bVar1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff50);
  }
  if (local_58 == 0) {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool gguf_read_emplace_helper(const struct gguf_reader & gr, std::vector<struct gguf_kv> & kv, const std::string & key, const bool is_array, const size_t n) {
    if (is_array) {
        std::vector<T> value;
        try {
            if (!gr.read(value, n)) {
                return false;
            }
        } catch (std::length_error &) {
            fprintf(stderr, "%s: encountered length_error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        } catch (std::bad_alloc &) {
            fprintf(stderr, "%s: encountered bad_alloc error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        }
        kv.emplace_back(key, value);
    } else {
        T value;
        if (!gr.read(value)) {
            return false;
        }
        kv.emplace_back(key, value);
    }
    return true;
}